

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

void __thiscall CVmObjDate::save_to_file(CVmObjDate *this,CVmFile *fp)

{
  char *pcVar1;
  int32_t tmp;
  undefined8 in_RAX;
  char b [4];
  char b_1 [4];
  undefined4 local_18;
  undefined4 local_14;
  
  pcVar1 = (this->super_CVmObject).ext_;
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),*(undefined4 *)pcVar1);
  CVmFile::write_bytes(fp,(char *)&local_18,4);
  _local_18 = CONCAT44(*(undefined4 *)(pcVar1 + 4),local_18);
  CVmFile::write_bytes(fp,(char *)&local_14,4);
  return;
}

Assistant:

void CVmObjDate::save_to_file(VMG_ class CVmFile *fp)
{
    /* get our extension */
    vm_date_ext *ext = get_ext();

    /* write the extension data */
    fp->write_int4(ext->dayno);
    fp->write_uint4(ext->daytime);
}